

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.h
# Opt level: O2

void __thiscall RasterizerA3<8U>::clear(RasterizerA3<8U> *this)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  Cell *pCVar10;
  ulong uVar11;
  
  if ((this->super_CellRasterizer).super_Rasterizer._width != 0) {
    uVar3 = (ulong)(this->_yBounds).start;
    iVar1 = (this->_yBounds).end;
    puVar9 = this->_bits + this->_bitStride * uVar3;
    pCVar10 = this->_cells + this->_cellStride * uVar3;
    for (; uVar3 <= (ulong)(long)iVar1; uVar3 = uVar3 + 1) {
      sVar5 = this->_bitStride;
      uVar11 = 0;
      do {
        uVar7 = *puVar9;
        *puVar9 = 0;
        if (uVar7 != 0) {
          uVar6 = (ulong)(this->super_CellRasterizer).super_Rasterizer._width;
          if (uVar11 + 0x200 < uVar6) {
            uVar6 = uVar11 + 0x200;
          }
          do {
            lVar2 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
              }
            }
            uVar8 = -1L << ((byte)lVar2 & 0x3f);
            uVar4 = (uint)((int)lVar2 << 3) | uVar11;
            if (uVar7 == uVar8) {
              uVar8 = uVar4 + 8;
              uVar7 = 0;
            }
            else {
              uVar8 = uVar8 ^ uVar7;
              lVar2 = 0;
              if (uVar8 != 0) {
                for (; (uVar8 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
                }
              }
              uVar7 = -1L << ((byte)lVar2 & 0x3f) ^ uVar8;
              uVar8 = (uint)((int)lVar2 << 3) | uVar11;
            }
            if (uVar6 <= uVar8) {
              uVar8 = uVar6;
            }
            memset(pCVar10 + uVar4,0,(uVar8 - uVar4) * 8);
          } while (uVar7 != 0);
        }
        uVar11 = uVar11 + 0x200;
        puVar9 = puVar9 + 1;
        sVar5 = sVar5 - 1;
      } while (sVar5 != 0);
      pCVar10 = pCVar10 + this->_cellStride;
    }
    (this->_yBounds).start = 0x7fffffff;
    (this->_yBounds).end = 0;
  }
  return;
}

Assistant:

inline bool isInitialized() const noexcept { return _width != 0; }